

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
__thiscall
Js::Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Utf8SourceInfo *this,Recycler *recycler)

{
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  
  pLVar1 = (this->topLevelFunctionInfoList).ptr;
  if (pLVar1 != (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    return pLVar1;
  }
  pLVar1 = JsUtil::
           List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::New(recycler,4);
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierSet(&this->topLevelFunctionInfoList,pLVar1);
  return (this->topLevelFunctionInfoList).ptr;
}

Assistant:

JsUtil::List<FunctionInfo *, Recycler> *
    Utf8SourceInfo::EnsureTopLevelFunctionInfoList(Recycler * recycler)
    {
        if (this->topLevelFunctionInfoList == nullptr)
        {
            this->topLevelFunctionInfoList = JsUtil::List<FunctionInfo *, Recycler>::New(recycler);
        }
        return this->topLevelFunctionInfoList;
    }